

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::ClearTest::ClearColor<unsigned_int>
          (ClearTest *this,GLenum buffer,GLint drawbuffer,GLuint value)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  GLuint value_vector [4];
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x200))(this->m_fbo,buffer,drawbuffer);
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 != 0) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"ClearNamedFramebufferuiv unexpectedly generated ",0x30);
    local_1b8.m_getName = glu::getErrorName;
    local_1b8.m_value = iVar1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," error. Test fails.",0x13);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
  }
  return iVar1 == 0;
}

Assistant:

bool ClearTest::ClearColor<glw::GLuint>(glw::GLenum buffer, glw::GLint drawbuffer, glw::GLuint value)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint value_vector[4] = { value, 0, 0, 0 };

	gl.clearNamedFramebufferuiv(m_fbo, buffer, drawbuffer, value_vector);

	if (glw::GLenum error = gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "ClearNamedFramebufferuiv unexpectedly generated " << glu::getErrorStr(error)
			<< " error. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}